

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scc.h
# Opt level: O1

int __thiscall
Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
::connect(Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
          *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  mapped_type *pmVar1;
  reference ppNVar2;
  undefined4 in_register_00000034;
  mapped_type *local_30;
  
  pmVar1 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this,(key_type *)CONCAT44(in_register_00000034,__fd));
  local_30 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this,(key_type *)__addr);
  std::
  vector<Graph<std::__cxx11::string,scc::AssocMapType>::Node_const*,std::allocator<Graph<std::__cxx11::string,scc::AssocMapType>::Node_const*>>
  ::emplace_back<Graph<std::__cxx11::string,scc::AssocMapType>::Node_const*>
            ((vector<Graph<std::__cxx11::string,scc::AssocMapType>::Node_const*,std::allocator<Graph<std::__cxx11::string,scc::AssocMapType>::Node_const*>>
              *)&pmVar1->edges,&local_30);
  pmVar1 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this,(key_type *)__addr);
  local_30 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this,(key_type *)CONCAT44(in_register_00000034,__fd));
  ppNVar2 = std::
            vector<Graph<std::__cxx11::string,scc::AssocMapType>::Node_const*,std::allocator<Graph<std::__cxx11::string,scc::AssocMapType>::Node_const*>>
            ::emplace_back<Graph<std::__cxx11::string,scc::AssocMapType>::Node_const*>
                      ((vector<Graph<std::__cxx11::string,scc::AssocMapType>::Node_const*,std::allocator<Graph<std::__cxx11::string,scc::AssocMapType>::Node_const*>>
                        *)&pmVar1->dual_edges,&local_30);
  return (int)ppNVar2;
}

Assistant:

void connect(const Index &x, const Index &y) {
        nodes[x].edges.push_back(&nodes[y]);
        nodes[y].dual_edges.push_back(&nodes[x]);
    }